

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O1

void fl_trigger_clipboard_notify(int source)

{
  Clipboard_Notify *pCVar1;
  Clipboard_Notify *pCVar2;
  
  pCVar2 = clip_notify_list;
  if (clip_notify_list != (Clipboard_Notify *)0x0) {
    do {
      pCVar1 = pCVar2->next;
      (*pCVar2->handler)(source,pCVar2->data);
      pCVar2 = pCVar1;
    } while (pCVar1 != (Clipboard_Notify *)0x0);
  }
  return;
}

Assistant:

void fl_trigger_clipboard_notify(int source) {
  struct Clipboard_Notify *node, *next;

  node = clip_notify_list;
  while (node != NULL) {
    next = node->next;
    node->handler(source, node->data);
    node = next;
  }
}